

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpbyepacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPBYEPacket::RTCPBYEPacket(RTCPBYEPacket *this,uint8_t *data,size_t datalength)

{
  byte bVar1;
  ulong uVar2;
  size_t reaslen;
  uint8_t *reasonlength;
  size_t ssrclen;
  size_t sStack_30;
  uint8_t padcount;
  size_t len;
  RTCPCommonHeader *hdr;
  size_t datalength_local;
  uint8_t *data_local;
  RTCPBYEPacket *this_local;
  
  RTCPPacket::RTCPPacket(&this->super_RTCPPacket,BYE,data,datalength);
  (this->super_RTCPPacket)._vptr_RTCPPacket = (_func_int **)&PTR__RTCPBYEPacket_00193d70;
  (this->super_RTCPPacket).knownformat = false;
  this->reasonoffset = 0;
  sStack_30 = datalength;
  if ((*data >> 5 & 1) != 0) {
    bVar1 = data[datalength - 1];
    if ((bVar1 & 3) != 0) {
      return;
    }
    if (datalength <= bVar1) {
      return;
    }
    sStack_30 = datalength - bVar1;
  }
  uVar2 = (ulong)(*data & 0x1f) * 4 + 4;
  if (uVar2 <= sStack_30) {
    if (uVar2 < sStack_30) {
      if ((sStack_30 - uVar2) - 1 < (ulong)data[uVar2]) {
        return;
      }
      this->reasonoffset = uVar2;
    }
    (this->super_RTCPPacket).knownformat = true;
  }
  return;
}

Assistant:

RTCPBYEPacket::RTCPBYEPacket(uint8_t *data,size_t datalength)
	: RTCPPacket(BYE,data,datalength)
{
	knownformat = false;
	reasonoffset = 0;	
	
	RTCPCommonHeader *hdr;
	size_t len = datalength;
	
	hdr = (RTCPCommonHeader *)data;
	if (hdr->padding)
	{
		uint8_t padcount = data[datalength-1];
		if ((padcount & 0x03) != 0) // not a multiple of four! (see rfc 3550 p 37)
			return;
		if (((size_t)padcount) >= len)
			return;
		len -= (size_t)padcount;
	}
	
	size_t ssrclen = ((size_t)(hdr->count))*sizeof(uint32_t) + sizeof(RTCPCommonHeader);
	if (ssrclen > len)
		return;
	if (ssrclen < len) // there's probably a reason for leaving
	{
		uint8_t *reasonlength = (data+ssrclen);
		size_t reaslen = (size_t)(*reasonlength);
		if (reaslen > (len-ssrclen-1))
			return;
		reasonoffset = ssrclen;
	}
	knownformat = true;
}